

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_ModRM.c
# Opt level: O3

long getDisp8N(PDISASM pMyDisasm)

{
  int iVar1;
  long lVar2;
  byte bVar3;
  ulong uVar4;
  
  switch((pMyDisasm->Reserved_).EVEX.tupletype) {
  case '\x01':
    if ((pMyDisasm->Reserved_).EVEX.b == '\0') goto switchD_00141c24_caseD_3;
  case '\x06':
    bVar3 = (pMyDisasm->Reserved_).EVEX.W;
LAB_00141c6a:
    iVar1 = 4;
    break;
  case '\x02':
    if ((pMyDisasm->Reserved_).EVEX.b != '\0') {
      return 4;
    }
  case '\f':
    bVar3 = (pMyDisasm->Reserved_).VEX.L;
LAB_00141c77:
    iVar1 = 8;
    break;
  case '\x03':
switchD_00141c24_caseD_3:
    bVar3 = (pMyDisasm->Reserved_).VEX.L;
    goto LAB_00141cc3;
  case '\x04':
    return 1;
  case '\x05':
    return 2;
  case '\a':
    return 4;
  case '\b':
    return 8;
  case '\t':
    bVar3 = (pMyDisasm->Reserved_).EVEX.W;
    goto LAB_00141c77;
  case '\n':
    bVar3 = (pMyDisasm->Reserved_).EVEX.W;
LAB_00141cc3:
    iVar1 = 0x10;
    break;
  case '\v':
    return 0x20;
  case '\r':
    bVar3 = (pMyDisasm->Reserved_).VEX.L;
    goto LAB_00141c6a;
  case '\x0e':
    bVar3 = (pMyDisasm->Reserved_).VEX.L;
    iVar1 = 2;
    break;
  case '\x0f':
    return 0x10;
  case '\x10':
    uVar4 = (ulong)(pMyDisasm->Reserved_).VEX.L;
    lVar2 = -1;
    if (uVar4 < 3) {
      lVar2 = *(long *)(&DAT_00145670 + uVar4 * 8);
    }
    return lVar2;
  default:
    return -1;
  }
  return (long)(iVar1 << (bVar3 & 0x1f));
}

Assistant:

long __bea_callspec__ getDisp8N(PDISASM pMyDisasm)
{
  long N;
  switch (GV.EVEX.tupletype) {
    case FULL:
      if (GV.EVEX.b == 0) {
        N = 16 * (1 << GV.VEX.L);
      }
      else {
        N = 4 * (1 << GV.EVEX.W);
      }
      break;
    case HALF:
      if (GV.EVEX.b == 0) {
        N = 8 * (1 << GV.VEX.L);
      }
      else {
        N = 4;
      }
      break;
    case FULL_MEM:
      N = 16 * (1 << GV.VEX.L);
      break;
    case TUPLE1_SCALAR:
      N = 4 * (1 << GV.EVEX.W);
      break;
    case TUPLE1_SCALAR__8:
      N = 1;
      break;
    case TUPLE1_SCALAR__16:
      N = 2;
      break;
    case TUPLE1_FIXED__32:
      N = 4;
      break;
    case TUPLE1_FIXED__64:
      N = 8;
      break;
    case TUPLE2:
      N = 8 * (1 << GV.EVEX.W);
      break;
    case TUPLE4:
      N = 16 * (1 << GV.EVEX.W);
      break;
    case TUPLE8:
      N = 32;
      break;
    case HALF_MEM:
      N = 8 * (1 << GV.VEX.L);
      break;
    case QUARTER_MEM:
      N = 4 * (1 << GV.VEX.L);
      break;
    case EIGHTH_MEM:
      N = 2 * (1 << GV.VEX.L);
      break;
    case MEM128:
      N = 16;
      break;
    case MOVDDUP:
      if (GV.VEX.L == 0) {
        N = 8;
      }
      else if (GV.VEX.L == 1) {
        N = 32;
      }
      else if (GV.VEX.L == 2) {
        N = 64;
      }
      else {
        N = -1;
      }
      break;
    default:
      N = -1;
  }
  return N;
}